

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O2

void __thiscall deci::stack_t::~stack_t(stack_t *this)

{
  (*this->result->_vptr_value_t[3])();
  Drop(this,(int)((ulong)((long)(this->storage).
                                super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->storage).
                               super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
  dictionary_t::~dictionary_t(&this->context);
  std::_Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>::~_Vector_base
            ((_Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_> *)this);
  return;
}

Assistant:

stack_t::~stack_t() {
    this->result->Delete();
    this->Drop(this->Depth());
  }